

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  pointer puVar1;
  long *plVar2;
  char *pcVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [12];
  allocator<char> local_31;
  long local_30;
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  
  std::current_exception();
  if (local_30 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Non C++ exception. Possibly a CLR exception.","");
  }
  else {
    std::__exception_ptr::exception_ptr::_M_release();
    puVar1 = (this->m_translators).
             super__Vector_base<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 == (this->m_translators).
                  super__Vector_base<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::current_exception();
      auVar6 = std::rethrow_exception((exception_ptr)&local_30);
      iVar5 = auVar6._8_4_;
      uVar4 = auVar6._0_8_;
      if (iVar5 == 6) {
        __cxa_begin_catch(uVar4);
        std::current_exception();
        std::rethrow_exception((exception_ptr)local_28);
      }
      else if (iVar5 != 5) {
        if (iVar5 == 4) {
          plVar2 = (long *)__cxa_begin_catch(uVar4);
          pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar3,&local_31);
        }
        else if (iVar5 == 3) {
          plVar2 = (long *)__cxa_begin_catch(uVar4);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
        }
        else {
          pcVar3 = (char *)__cxa_begin_catch(uVar4);
          if (iVar5 == 2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,pcVar3,&local_31);
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"Unknown exception","");
          }
        }
        __cxa_end_catch();
        return __return_storage_ptr__;
      }
      __cxa_begin_catch();
      std::current_exception();
      uVar4 = std::rethrow_exception((exception_ptr)local_20);
      __cxa_end_catch();
      _Unwind_Resume(uVar4);
    }
    (*puVar1->m_ptr->_vptr_IExceptionTranslator[2])(__return_storage_ptr__,puVar1->m_ptr,puVar1 + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExceptionTranslatorRegistry::translateActiveException() const {
        // Compiling a mixed mode project with MSVC means that CLR
        // exceptions will be caught in (...) as well. However, these do
        // do not fill-in std::current_exception and thus lead to crash
        // when attempting rethrow.
        // /EHa switch also causes structured exceptions to be caught
        // here, but they fill-in current_exception properly, so
        // at worst the output should be a little weird, instead of
        // causing a crash.
        if ( std::current_exception() == nullptr ) {
            return "Non C++ exception. Possibly a CLR exception.";
        }

        // First we try user-registered translators. If none of them can
        // handle the exception, it will be rethrown handled by our defaults.
        try {
            return tryTranslators(m_translators);
        }
        // To avoid having to handle TFE explicitly everywhere, we just
        // rethrow it so that it goes back up the caller.
        catch( TestFailureException& ) {
            std::rethrow_exception(std::current_exception());
        }
        catch( TestSkipException& ) {
            std::rethrow_exception(std::current_exception());
        }
        catch( std::exception const& ex ) {
            return ex.what();
        }
        catch( std::string const& msg ) {
            return msg;
        }
        catch( const char* msg ) {
            return msg;
        }
        catch(...) {
            return "Unknown exception";
        }
    }